

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadCodePointRest<true>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,codepoint_t lower,
          EncodedCharPtr *startingLocation,EncodedCharPtr endOfSource,codepoint_t *outChar,
          bool *outContainsMultiUnitChar)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  OLECHAR OVar4;
  codepoint_t cVar5;
  undefined4 *puVar6;
  bool *local_48;
  EncodedCharPtr currentLocation;
  bool *local_38;
  
  currentLocation = (EncodedCharPtr)startingLocation;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = (bool *)endOfSource;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14d,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar3) goto LAB_00d57cec;
    *puVar6 = 0;
    endOfSource = local_38;
  }
  local_38 = outContainsMultiUnitChar;
  if (outContainsMultiUnitChar == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14e,"(outContainsMultiUnitChar != nullptr)",
                       "outContainsMultiUnitChar != nullptr");
    if (!bVar3) goto LAB_00d57cec;
    *puVar6 = 0;
  }
  if (this->es6UnicodeMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x14f,"(es6UnicodeMode)","es6UnicodeMode");
    if (!bVar3) goto LAB_00d57cec;
    *puVar6 = 0;
  }
  bVar3 = Js::NumberUtilities::IsSurrogateLowerPart(lower);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x150,"(Js::NumberUtilities::IsSurrogateLowerPart(lower))",
                       "Js::NumberUtilities::IsSurrogateLowerPart(lower)");
    if (!bVar3) {
LAB_00d57cec:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  local_48 = *(bool **)currentLocation;
  *outChar = lower;
  if (local_48 < endOfSource) {
    sVar1 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
    OVar4 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                      (&this->super_UTF8EncodingPolicyBase<false>,&local_48,endOfSource);
    bVar3 = Js::NumberUtilities::IsSurrogateUpperPart((uint)(ushort)OVar4);
    if (bVar3) {
      cVar5 = Js::NumberUtilities::SurrogatePairAsCodePoint(lower,(uint)(ushort)OVar4);
      *outChar = cVar5;
      if (0x7f < (ushort)OVar4) {
        *local_38 = true;
      }
      *(bool **)currentLocation = local_48;
    }
    else {
      (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = sVar1;
    }
  }
  return true;
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadCodePointRest(codepoint_t lower, EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar, bool *outContainsMultiUnitChar)

{
    Assert(outChar != nullptr);
    Assert(outContainsMultiUnitChar != nullptr);
    Assert(es6UnicodeMode);
    Assert(Js::NumberUtilities::IsSurrogateLowerPart(lower));

    EncodedCharPtr currentLocation = startingLocation;
    *outChar = lower;

    if (currentLocation < endOfSource)
    {
        size_t restorePoint = this->m_cMultiUnits;
        codepoint_t upper = this->template ReadFull<bScan>(currentLocation, endOfSource);

        if (Js::NumberUtilities::IsSurrogateUpperPart(upper))
        {
            *outChar = Js::NumberUtilities::SurrogatePairAsCodePoint(lower, upper);

            if (this->IsMultiUnitChar(static_cast<OLECHAR>(upper)))
            {
                *outContainsMultiUnitChar = true;
            }

            startingLocation = currentLocation;
        }
        else
        {
            this->RestoreMultiUnits(restorePoint);
        }
    }

    return true;
}